

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_rect.cpp
# Opt level: O2

void __thiscall CUIRect::Draw(CUIRect *this,vec4 *Color,float Rounding,int Corners)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined8 uVar8;
  undefined4 uVar15;
  long lVar16;
  CFreeformItem *pCVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  long in_FS_OFFSET;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar32;
  float fVar33;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar34;
  float fVar35;
  float fVar36;
  ulong uStack_550;
  CQuadItem a_QuadItems [9];
  CFreeformItem a_FreeformItems [32];
  
  lVar16 = *(long *)(in_FS_OFFSET + 0x28);
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x13])(s_pGraphics,0xffffffffffffffff);
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x21])
            ((ulong)(uint)((Color->field_0).x * (Color->field_3).w),
             (ulong)(uint)((Color->field_1).y * (Color->field_3).w));
  auVar31._0_4_ = -(uint)((Corners & 8U) == 0);
  auVar31._4_4_ = -(uint)((Corners & 4U) == 0);
  auVar31._8_4_ = -(uint)((Corners & 2U) == 0);
  auVar31._12_4_ = -(uint)((Corners & 1U) == 0);
  auVar30._0_4_ = -(uint)((Corners & 0x80U) == 0);
  auVar30._4_4_ = -(uint)((Corners & 0x40U) == 0);
  auVar30._8_4_ = -(uint)((Corners & 0x20U) == 0);
  auVar30._12_4_ = -(uint)((Corners & 0x10U) == 0);
  auVar31 = packssdw(auVar30,auVar31);
  auVar31 = packsswb(auVar31,auVar31);
  uVar22 = 0;
  uVar20 = 0;
  while (uVar22 < 8) {
    fVar35 = (float)(int)uVar22;
    fVar27 = (float)(int)(uVar22 + 1) / 5.092958;
    uVar22 = uVar22 + 2;
    fVar23 = cosf(fVar35 / 5.092958);
    fVar24 = cosf(fVar27);
    fVar25 = cosf((float)(int)uVar22 / 5.092958);
    fVar35 = sinf(fVar35 / 5.092958);
    fVar27 = sinf(fVar27);
    fVar26 = sinf((float)(int)uVar22 / 5.092958);
    if ((auVar31 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      uVar1 = this->x;
      uVar9 = this->y;
      a_FreeformItems[(int)uVar20].m_X0 = (float)uVar1 + Rounding;
      a_FreeformItems[(int)uVar20].m_Y0 = (float)uVar9 + Rounding;
      fVar28 = (1.0 - fVar23) * Rounding + (float)uVar1;
      fVar32 = (1.0 - fVar35) * Rounding + (float)uVar9;
      fVar33 = (1.0 - fVar25) * Rounding + (float)uVar1;
      fVar34 = (1.0 - fVar26) * Rounding + (float)uVar9;
      pCVar17 = a_FreeformItems + (int)uVar20;
      pCVar17->m_X1 = fVar28;
      pCVar17->m_Y1 = fVar32;
      pCVar17->m_X2 = fVar33;
      pCVar17->m_Y2 = fVar34;
      a_FreeformItems[(int)uVar20].m_X3 = (1.0 - fVar24) * Rounding + (float)uVar1;
      a_FreeformItems[(int)uVar20].m_Y3 = (1.0 - fVar27) * Rounding + (float)uVar9;
      uVar20 = uVar20 + 1;
    }
    uVar19 = uVar20;
    if ((auVar31 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      fVar36 = this->y;
      fVar29 = (this->x + this->w) - Rounding;
      a_FreeformItems[(int)uVar20].m_X0 = fVar29;
      uVar19 = uVar20 + 1;
      a_FreeformItems[(int)uVar20].m_Y0 = fVar36 + Rounding;
      a_FreeformItems[(int)uVar20].m_X1 = fVar23 * Rounding + fVar29;
      a_FreeformItems[(int)uVar20].m_Y1 = (1.0 - fVar35) * Rounding + fVar36;
      a_FreeformItems[(int)uVar20].m_X2 = fVar25 * Rounding + fVar29;
      a_FreeformItems[(int)uVar20].m_Y2 = (1.0 - fVar26) * Rounding + fVar36;
      a_FreeformItems[(int)uVar20].m_X3 = fVar24 * Rounding + fVar29;
      a_FreeformItems[(int)uVar20].m_Y3 = (1.0 - fVar27) * Rounding + fVar36;
    }
    uVar20 = uVar19;
    if ((auVar31 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      fVar36 = this->x;
      fVar29 = (this->y + this->h) - Rounding;
      uVar20 = uVar19 + 1;
      a_FreeformItems[(int)uVar19].m_X0 = fVar36 + Rounding;
      a_FreeformItems[(int)uVar19].m_Y0 = fVar29;
      a_FreeformItems[(int)uVar19].m_X1 = (1.0 - fVar23) * Rounding + fVar36;
      a_FreeformItems[(int)uVar19].m_Y1 = fVar35 * Rounding + fVar29;
      a_FreeformItems[(int)uVar19].m_X2 = (1.0 - fVar25) * Rounding + fVar36;
      a_FreeformItems[(int)uVar19].m_Y2 = fVar26 * Rounding + fVar29;
      a_FreeformItems[(int)uVar19].m_X3 = (1.0 - fVar24) * Rounding + fVar36;
      a_FreeformItems[(int)uVar19].m_Y3 = fVar27 * Rounding + fVar29;
    }
    uVar19 = uVar20;
    if ((auVar31 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      uVar19 = uVar20 + 1;
      uVar2 = this->x;
      uVar10 = this->y;
      uVar3 = this->w;
      uVar11 = this->h;
      fVar36 = ((float)uVar3 + (float)uVar2) - Rounding;
      fVar29 = ((float)uVar11 + (float)uVar10) - Rounding;
      a_FreeformItems[(int)uVar20].m_X0 = fVar36;
      a_FreeformItems[(int)uVar20].m_Y0 = fVar29;
      a_FreeformItems[(int)uVar20].m_X1 = fVar23 * Rounding + fVar36;
      a_FreeformItems[(int)uVar20].m_Y1 = fVar35 * Rounding + fVar29;
      a_FreeformItems[(int)uVar20].m_X2 = fVar25 * Rounding + fVar36;
      a_FreeformItems[(int)uVar20].m_Y2 = fVar26 * Rounding + fVar29;
      a_FreeformItems[(int)uVar20].m_X3 = fVar24 * Rounding + fVar36;
      a_FreeformItems[(int)uVar20].m_Y3 = fVar27 * Rounding + fVar29;
    }
    uVar20 = uVar19;
    if ((auVar31 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      uVar20 = uVar19 + 1;
      uVar4 = this->x;
      uVar12 = this->y;
      fVar36 = (float)uVar12 - Rounding;
      a_FreeformItems[(int)uVar19].m_X0 = (float)uVar4;
      a_FreeformItems[(int)uVar19].m_Y0 = (float)uVar12;
      a_FreeformItems[(int)uVar19].m_X1 = (1.0 - fVar23) * Rounding + (float)uVar4;
      a_FreeformItems[(int)uVar19].m_Y1 = fVar35 * Rounding + fVar36;
      a_FreeformItems[(int)uVar19].m_X2 = (1.0 - fVar25) * Rounding + (float)uVar4;
      a_FreeformItems[(int)uVar19].m_Y2 = fVar26 * Rounding + fVar36;
      a_FreeformItems[(int)uVar19].m_X3 = (1.0 - fVar24) * Rounding + (float)uVar4;
      a_FreeformItems[(int)uVar19].m_Y3 = fVar27 * Rounding + fVar36;
    }
    uVar19 = uVar20;
    if ((auVar31 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      fVar36 = this->y;
      fVar29 = this->x + this->w;
      uVar19 = uVar20 + 1;
      a_FreeformItems[(int)uVar20].m_X0 = fVar29;
      a_FreeformItems[(int)uVar20].m_Y0 = fVar36;
      fVar29 = fVar29 - Rounding;
      fVar36 = fVar36 - Rounding;
      a_FreeformItems[(int)uVar20].m_X1 = fVar23 * Rounding + fVar29;
      a_FreeformItems[(int)uVar20].m_Y1 = fVar35 * Rounding + fVar36;
      a_FreeformItems[(int)uVar20].m_X2 = fVar25 * Rounding + fVar29;
      a_FreeformItems[(int)uVar20].m_Y2 = fVar26 * Rounding + fVar36;
      a_FreeformItems[(int)uVar20].m_X3 = fVar24 * Rounding + fVar29;
      a_FreeformItems[(int)uVar20].m_Y3 = fVar27 * Rounding + fVar36;
    }
    uVar21 = uVar19;
    if ((auVar31 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      fVar36 = this->x;
      fVar29 = this->y + this->h;
      uVar21 = uVar19 + 1;
      a_FreeformItems[(int)uVar19].m_X0 = fVar36;
      a_FreeformItems[(int)uVar19].m_Y0 = fVar29;
      a_FreeformItems[(int)uVar19].m_X1 = (1.0 - fVar23) * Rounding + fVar36;
      a_FreeformItems[(int)uVar19].m_Y1 = (1.0 - fVar35) * Rounding + fVar29;
      a_FreeformItems[(int)uVar19].m_X2 = (1.0 - fVar25) * Rounding + fVar36;
      a_FreeformItems[(int)uVar19].m_Y2 = (1.0 - fVar26) * Rounding + fVar29;
      a_FreeformItems[(int)uVar19].m_X3 = (1.0 - fVar24) * Rounding + fVar36;
      a_FreeformItems[(int)uVar19].m_Y3 = (1.0 - fVar27) * Rounding + fVar29;
    }
    uVar20 = uVar21;
    if ((auVar31 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      uVar20 = uVar21 + 1;
      uVar5 = this->x;
      uVar13 = this->y;
      uVar6 = this->w;
      uVar14 = this->h;
      fVar36 = (float)uVar6 + (float)uVar5;
      fVar29 = (float)uVar14 + (float)uVar13;
      a_FreeformItems[(int)uVar21].m_X0 = fVar36;
      a_FreeformItems[(int)uVar21].m_Y0 = fVar29;
      a_FreeformItems[(int)uVar21].m_X1 = fVar23 * Rounding + (fVar36 - Rounding);
      a_FreeformItems[(int)uVar21].m_Y1 = (1.0 - fVar35) * Rounding + fVar29;
      a_FreeformItems[(int)uVar21].m_X2 = fVar25 * Rounding + (fVar36 - Rounding);
      a_FreeformItems[(int)uVar21].m_Y2 = (1.0 - fVar26) * Rounding + fVar29;
      a_FreeformItems[(int)uVar21].m_X3 = fVar24 * Rounding + (fVar36 - Rounding);
      a_FreeformItems[(int)uVar21].m_Y3 = (1.0 - fVar27) * Rounding + fVar29;
    }
  }
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1e])
            (s_pGraphics,a_FreeformItems,(ulong)uVar20);
  fVar23 = -Rounding;
  uVar8._0_4_ = this->x;
  uVar8._4_4_ = this->y;
  uVar7 = this->w;
  uVar15 = this->h;
  a_QuadItems[0].m_X = Rounding + (float)uVar8;
  a_QuadItems[0].m_Y = Rounding + uVar8._4_4_;
  fVar24 = (float)uVar8 + (float)uVar7;
  fVar25 = uVar8._4_4_ + (float)uVar15;
  a_QuadItems[0].m_Width = (float)uVar7 - (Rounding + Rounding);
  a_QuadItems[0].m_Height = (float)uVar15 - (Rounding + Rounding);
  a_QuadItems[2].m_Y = fVar25 - Rounding;
  a_QuadItems[4].m_X = fVar24 - Rounding;
  if ((auVar31 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    uStack_550 = 5;
  }
  else {
    uStack_550 = 6;
    a_QuadItems[5]._0_8_ = uVar8;
    a_QuadItems[5].m_Width = Rounding;
    a_QuadItems[5].m_Height = Rounding;
  }
  if ((auVar31 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    uVar18 = (ulong)(uint)((int)uStack_550 << 4);
    *(float *)((long)&a_QuadItems[0].m_X + uVar18) = fVar24;
    *(float *)((long)&a_QuadItems[0].m_Y + uVar18) = uVar8._4_4_;
    *(float *)((long)&a_QuadItems[0].m_Width + uVar18) = fVar23;
    *(float *)((long)&a_QuadItems[0].m_Height + uVar18) = Rounding;
    uStack_550 = (ulong)((int)uStack_550 + 1);
  }
  if ((auVar31 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    uVar18 = (ulong)(uint)((int)uStack_550 << 4);
    *(float *)((long)&a_QuadItems[0].m_X + uVar18) = (float)uVar8;
    *(float *)((long)&a_QuadItems[0].m_Y + uVar18) = fVar25;
    *(float *)((long)&a_QuadItems[0].m_Width + uVar18) = Rounding;
    *(float *)((long)&a_QuadItems[0].m_Height + uVar18) = fVar23;
    uStack_550 = (ulong)((int)uStack_550 + 1);
  }
  if ((auVar31 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    uVar18 = (ulong)(uint)((int)uStack_550 << 4);
    *(ulong *)((long)&a_QuadItems[0].m_X + uVar18) = CONCAT44(fVar25,fVar24);
    *(float *)((long)&a_QuadItems[0].m_Width + uVar18) = fVar23;
    *(float *)((long)&a_QuadItems[0].m_Height + uVar18) = fVar23;
    uStack_550 = (ulong)((int)uStack_550 + 1);
  }
  a_QuadItems[1].m_X = a_QuadItems[0].m_X;
  a_QuadItems[1].m_Y = uVar8._4_4_;
  a_QuadItems[1].m_Width = a_QuadItems[0].m_Width;
  a_QuadItems[1].m_Height = Rounding;
  a_QuadItems[2].m_X = a_QuadItems[0].m_X;
  a_QuadItems[2].m_Width = a_QuadItems[0].m_Width;
  a_QuadItems[2].m_Height = Rounding;
  a_QuadItems[3].m_X = (float)uVar8;
  a_QuadItems[3].m_Y = a_QuadItems[0].m_Y;
  a_QuadItems[3].m_Width = Rounding;
  a_QuadItems[3].m_Height = a_QuadItems[0].m_Height;
  a_QuadItems[4].m_Y = a_QuadItems[0].m_Y;
  a_QuadItems[4].m_Width = Rounding;
  a_QuadItems[4].m_Height = a_QuadItems[0].m_Height;
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(s_pGraphics,a_QuadItems,uStack_550);
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar16) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CUIRect::Draw(const vec4 &Color, float Rounding, int Corners) const
{
	s_pGraphics->TextureClear();

	// TODO: FIX US
	s_pGraphics->QuadsBegin();
	s_pGraphics->SetColor(Color.r*Color.a, Color.g*Color.a, Color.b*Color.a, Color.a);

	const float r = Rounding;

	IGraphics::CFreeformItem a_FreeformItems[NUM_ROUND_CORNER_SEGMENTS/2*8];
	int NumFreeformItems = 0;
	for(int i = 0; i < NUM_ROUND_CORNER_SEGMENTS; i += 2)
	{
		float a1 = i/s_CornerAnglePerSegment;
		float a2 = (i+1)/s_CornerAnglePerSegment;
		float a3 = (i+2)/s_CornerAnglePerSegment;
		float Ca1 = cosf(a1);
		float Ca2 = cosf(a2);
		float Ca3 = cosf(a3);
		float Sa1 = sinf(a1);
		float Sa2 = sinf(a2);
		float Sa3 = sinf(a3);

		if(Corners&CORNER_TL)
			a_FreeformItems[NumFreeformItems++] = IGraphics::CFreeformItem(
				x+r, y+r,
				x+(1-Ca1)*r, y+(1-Sa1)*r,
				x+(1-Ca3)*r, y+(1-Sa3)*r,
				x+(1-Ca2)*r, y+(1-Sa2)*r);

		if(Corners&CORNER_TR)
			a_FreeformItems[NumFreeformItems++] = IGraphics::CFreeformItem(
				x+w-r, y+r,
				x+w-r+Ca1*r, y+(1-Sa1)*r,
				x+w-r+Ca3*r, y+(1-Sa3)*r,
				x+w-r+Ca2*r, y+(1-Sa2)*r);

		if(Corners&CORNER_BL)
			a_FreeformItems[NumFreeformItems++] = IGraphics::CFreeformItem(
				x+r, y+h-r,
				x+(1-Ca1)*r, y+h-r+Sa1*r,
				x+(1-Ca3)*r, y+h-r+Sa3*r,
				x+(1-Ca2)*r, y+h-r+Sa2*r);

		if(Corners&CORNER_BR)
			a_FreeformItems[NumFreeformItems++] = IGraphics::CFreeformItem(
				x+w-r, y+h-r,
				x+w-r+Ca1*r, y+h-r+Sa1*r,
				x+w-r+Ca3*r, y+h-r+Sa3*r,
				x+w-r+Ca2*r, y+h-r+Sa2*r);

		if(Corners&CORNER_ITL)
			a_FreeformItems[NumFreeformItems++] = IGraphics::CFreeformItem(
				x, y,
				x+(1-Ca1)*r, y-r+Sa1*r,
				x+(1-Ca3)*r, y-r+Sa3*r,
				x+(1-Ca2)*r, y-r+Sa2*r);

		if(Corners&CORNER_ITR)
			a_FreeformItems[NumFreeformItems++] = IGraphics::CFreeformItem(
				x+w, y,
				x+w-r+Ca1*r, y-r+Sa1*r,
				x+w-r+Ca3*r, y-r+Sa3*r,
				x+w-r+Ca2*r, y-r+Sa2*r);

		if(Corners&CORNER_IBL)
			a_FreeformItems[NumFreeformItems++] = IGraphics::CFreeformItem(
				x, y+h,
				x+(1-Ca1)*r, y+h+(1-Sa1)*r,
				x+(1-Ca3)*r, y+h+(1-Sa3)*r,
				x+(1-Ca2)*r, y+h+(1-Sa2)*r);

		if(Corners&CORNER_IBR)
			a_FreeformItems[NumFreeformItems++] = IGraphics::CFreeformItem(
				x+w, y+h,
				x+w-r+Ca1*r, y+h+(1-Sa1)*r,
				x+w-r+Ca3*r, y+h+(1-Sa3)*r,
				x+w-r+Ca2*r, y+h+(1-Sa2)*r);
	}
	s_pGraphics->QuadsDrawFreeform(a_FreeformItems, NumFreeformItems);

	IGraphics::CQuadItem a_QuadItems[9];
	int NumQuadItems = 0;
	a_QuadItems[NumQuadItems++] = IGraphics::CQuadItem(x+r, y+r, w-r*2, h-r*2); // center
	a_QuadItems[NumQuadItems++] = IGraphics::CQuadItem(x+r, y, w-r*2, r); // top
	a_QuadItems[NumQuadItems++] = IGraphics::CQuadItem(x+r, y+h-r, w-r*2, r); // bottom
	a_QuadItems[NumQuadItems++] = IGraphics::CQuadItem(x, y+r, r, h-r*2); // left
	a_QuadItems[NumQuadItems++] = IGraphics::CQuadItem(x+w-r, y+r, r, h-r*2); // right

	if(!(Corners&CORNER_TL)) a_QuadItems[NumQuadItems++] = IGraphics::CQuadItem(x, y, r, r);
	if(!(Corners&CORNER_TR)) a_QuadItems[NumQuadItems++] = IGraphics::CQuadItem(x+w, y, -r, r);
	if(!(Corners&CORNER_BL)) a_QuadItems[NumQuadItems++] = IGraphics::CQuadItem(x, y+h, r, -r);
	if(!(Corners&CORNER_BR)) a_QuadItems[NumQuadItems++] = IGraphics::CQuadItem(x+w, y+h, -r, -r);

	s_pGraphics->QuadsDrawTL(a_QuadItems, NumQuadItems);
	s_pGraphics->QuadsEnd();
}